

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindSelectNode
          (Binder *this,SelectNode *statement,
          unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
          *from_table)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  LogicalType *this_00;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> __p;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  pointer puVar4;
  pointer puVar5;
  ClientContext *pCVar6;
  pointer puVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  ulong uVar9;
  optional_idx oVar10;
  pointer pcVar11;
  _Head_base<0UL,_duckdb::BoundSelectNode_*,_false> _Var12;
  undefined1 auVar13 [8];
  pointer pLVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  __uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> _Var18;
  pointer pBVar19;
  pointer pBVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  BoundSelectNode *this_01;
  idx_t iVar24;
  pointer pBVar25;
  reference pvVar26;
  pointer pBVar27;
  pointer pPVar28;
  mapped_type *pmVar29;
  reference pvVar30;
  mapped_type *pmVar31;
  type pBVar32;
  optional_ptr<duckdb::LogicalType,_true> oVar33;
  type pEVar34;
  mapped_type *pmVar35;
  pointer pBVar36;
  pointer pEVar37;
  BoundExpandedExpression *pBVar38;
  reference this_02;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_03;
  reference pvVar39;
  BinderException *pBVar40;
  undefined8 *in_RCX;
  long lVar41;
  BoundColumnReferenceInfo *bound_qualify_col;
  SelectNode *pSVar42;
  Binder *pBVar43;
  value_type *__x;
  __node_base *p_Var44;
  undefined8 *puVar45;
  pointer pBVar46;
  pointer puVar47;
  size_type __n;
  byte bVar48;
  initializer_list<std::reference_wrapper<duckdb::Binder>_> __l;
  ColumnBinding binding;
  templated_unique_single_t result;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  function;
  LogicalType result_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_expr;
  vector<unsigned_long,_true> group_by_all_indexes;
  vector<duckdb::LogicalType,_true> internal_sql_types;
  FunctionBinder function_binder;
  vector<duckdb::BoundColumnReferenceInfo,_true> bound_qualify_columns;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unbound_groups;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  group_by_all_indexes_set;
  SelectBinder select_binder;
  OrderBinder order_binder;
  BoundGroupInformation info;
  _Head_base<0UL,_duckdb::BoundSelectNode_*,_false> local_670;
  SelectNode *local_668;
  Binder *local_660;
  undefined1 local_658 [16];
  string local_648;
  undefined1 local_628 [8];
  Binder *pBStack_620;
  ClientContext *local_618;
  optional_ptr<duckdb::DummyBinding,_true> local_608;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_600;
  Binder *local_5f8;
  iterator iStack_5f0;
  ClientContext *local_5e8;
  optional_ptr<duckdb::LogicalType,_true> local_5d8;
  pointer local_5d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5c8;
  optional_ptr<duckdb::LogicalType,_true> local_5b0;
  undefined1 local_5a8 [40];
  _Alloc_hider _Stack_580;
  size_type local_578;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_568;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_548;
  undefined1 local_530 [8];
  undefined1 local_528 [24];
  optional_ptr<duckdb::DummyBinding,_true> local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8 [2];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4a0;
  __uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> local_460;
  undefined8 *local_458;
  __node_base *local_450;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *local_448;
  _Alloc_hider local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [4];
  vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  local_3e8;
  bool local_3cf;
  undefined1 local_3b0 [32];
  float local_390;
  __node_base a_Stack_388 [14];
  element_type *local_318;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_308;
  Binder *pBStack_300;
  ClientContext *local_2f8;
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [72];
  undefined1 local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [56];
  case_insensitive_map_t<idx_t> local_1d0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_198;
  undefined1 local_160 [176];
  undefined8 auStack_b0 [14];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar48 = 0;
  local_668 = (SelectNode *)from_table;
  local_460._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)this;
  this_01 = (BoundSelectNode *)operator_new(0x318);
  BoundSelectNode::BoundSelectNode(this_01);
  local_670._M_head_impl = this_01;
  local_660 = (Binder *)statement;
  iVar24 = GenerateTableIndex((Binder *)statement);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->projection_index = iVar24;
  iVar24 = GenerateTableIndex(local_660);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->group_index = iVar24;
  iVar24 = GenerateTableIndex(local_660);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->aggregate_index = iVar24;
  iVar24 = GenerateTableIndex(local_660);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->groupings_index = iVar24;
  iVar24 = GenerateTableIndex(local_660);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->window_index = iVar24;
  iVar24 = GenerateTableIndex(local_660);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->prune_index = iVar24;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  _Var1._M_head_impl = (BoundTableRef *)*in_RCX;
  *in_RCX = 0;
  _Var2._M_head_impl =
       (pBVar25->from_table).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar25->from_table).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BoundTableRef + 8))();
  }
  pSVar42 = local_668;
  if ((local_668->sample).
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    pSVar42 = local_668;
    __p._M_head_impl =
         (local_668->sample).
         super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
         super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
         .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
    (local_668->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
    ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
    reset((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
          &pBVar25->sample_options,__p._M_head_impl);
  }
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600.ptr = (vector<duckdb::DummyBinding,_true> *)&pSVar42->select_list;
  ExpandStarExpressions
            (local_660,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)local_600.ptr,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_548);
  pSVar42 = local_668;
  if (local_548.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_548.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_428;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"SELECT list is empty after resolving * expressions!","");
    BinderException::BinderException(pBVar40,(string *)local_438);
    __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_438._0_8_ =
       (local_668->select_list).
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_668->select_list).
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_428[0]._0_8_ =
       (local_668->select_list).
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_668->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_548.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_668->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_548.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_668->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_548.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_438);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  local_658._8_8_ = &pBVar25->bind_state;
  if ((pSVar42->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pSVar42->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar24 = 0;
  }
  else {
    __n = 0;
    do {
      pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_600.ptr,__n);
      pBVar27 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar26);
      (*(pPVar28->super_BaseExpression)._vptr_BaseExpression[7])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 pPVar28);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(pBVar27->super_BoundQueryNode).names,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_);
      }
      ExpressionBinder::QualifyColumnNames(local_660,pvVar26);
      pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar26);
      if ((pPVar28->super_BaseExpression).alias._M_string_length != 0) {
        pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar26);
        pmVar29 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_658._8_8_,&(pPVar28->super_BaseExpression).alias);
        *pmVar29 = __n;
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->(pvVar26);
        pBVar27 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_670);
        pvVar30 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&(pBVar27->super_BoundQueryNode).names,__n);
        ::std::__cxx11::string::_M_assign((string *)pvVar30);
      }
      local_438._0_8_ =
           unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(pvVar26);
      pmVar31 = ::std::__detail::
                _Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(pBVar25->bind_state).projection_map,(key_type *)local_438);
      *pmVar31 = __n;
      pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar26);
      (*(pPVar28->super_BaseExpression)._vptr_BaseExpression[0xc])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 pPVar28);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&(pBVar25->bind_state).original_expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._0_8_)->_M_allocated_capacity + 8))();
      }
      __n = __n + 1;
      iVar24 = (long)(local_668->select_list).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_668->select_list).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
    } while (__n < iVar24);
  }
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->column_count = iVar24;
  if ((local_668->where_clause).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    expr = &local_668->where_clause;
    BindWhereStarExpression(local_660,expr);
    ColumnAliasBinder::ColumnAliasBinder
              ((ColumnAliasBinder *)local_530,(SelectBindState *)local_658._8_8_);
    WhereBinder::WhereBinder
              ((WhereBinder *)local_438,local_660,local_660->context,(ColumnAliasBinder *)local_530)
    ;
    local_208._0_8_ =
         (expr->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (expr->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_2b0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_438,(LogicalType *)local_208,false);
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    uVar15 = local_2b0._0_8_;
    local_2b0._0_8_ = (Expression *)0x0;
    _Var3._M_head_impl =
         (pBVar25->where_clause).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar25->where_clause).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar15;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((Expression *)local_2b0._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_2b0._0_8_)->_vptr_BaseExpression[1])();
    }
    if ((ParsedExpression *)local_208._0_8_ != (ParsedExpression *)0x0) {
      (*((BaseExpression *)local_208._0_8_)->_vptr_BaseExpression[1])();
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_438);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_528);
  }
  pBVar43 = local_660;
  local_438._0_8_ = local_660;
  __l._M_len = 1;
  __l._M_array = (iterator)local_438;
  ::std::
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ::vector(&local_2e8,__l,(allocator_type *)local_530);
  OrderBinder::OrderBinder
            ((OrderBinder *)local_2b0,
             (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_2e8,local_668,
             (SelectBindState *)local_658._8_8_);
  if (local_2e8.
      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.
                    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pBVar32 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_670);
  pSVar42 = local_668;
  PrepareModifiers(pBVar43,(OrderBinder *)local_2b0,&local_668->super_QueryNode,
                   &pBVar32->super_BoundQueryNode);
  local_568.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._0_8_ = local_208 + 0x30;
  local_208._8_8_ = &DAT_00000001;
  local_208._16_8_ = (_Hash_node_base *)0x0;
  local_208._24_8_ = 0;
  local_208._32_4_ = 1.0;
  local_208._40_8_ = 0;
  local_208._48_8_ = (__node_base_ptr)0x0;
  local_1d0._M_h._M_buckets = &local_1d0._M_h._M_single_bucket;
  local_1d0._M_h._M_bucket_count = 1;
  local_1d0._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d0._M_h._M_element_count = 0;
  local_1d0._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1d0._M_h._M_rehash_policy._M_next_resize = 0;
  local_1d0._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_198._M_buckets = &local_198._M_single_bucket;
  local_198._M_bucket_count = 1;
  local_198._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_198._M_element_count = 0;
  local_198._M_rehash_policy._M_max_load_factor = 1.0;
  local_198._M_rehash_policy._M_next_resize = 0;
  local_198._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = (pSVar42->groups).group_expressions.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (pSVar42->groups).group_expressions.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::resize(&local_568,(long)puVar5 - (long)puVar4 >> 3);
    pCVar6 = pBVar43->context;
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    pSVar42 = local_668;
    GroupBinder::GroupBinder
              ((GroupBinder *)local_530,pBVar43,pCVar6,local_668,pBVar25->group_index,
               (SelectBindState *)local_658._8_8_,&local_1d0);
    local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if ((pSVar42->groups).group_expressions.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pSVar42->groups).group_expressions.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      oVar33.ptr = (LogicalType *)&local_668->groups;
      local_440._M_p = local_160 + 0x90;
      local_5b0.ptr = (LogicalType *)(local_3b0 + 8);
      local_458 = auStack_b0;
      local_450 = a_Stack_388;
      this_00 = (LogicalType *)(local_5a8 + 0x20);
      local_448 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   *)&PTR__BaseScalarFunction_019937c0;
      local_608.ptr = (DummyBinding *)&PTR__AggregateFunction_01996688;
      local_5d8.ptr = oVar33.ptr;
      do {
        pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)oVar33.ptr,
                               (size_type)
                               local_5c8.
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar26);
        (*(pPVar28->super_BaseExpression)._vptr_BaseExpression[0xc])(local_438,pPVar28);
        uVar16 = local_438._0_8_;
        uVar15 = local_4c8[0]._M_allocated_capacity;
        local_438._0_8_ = (Binder *)0x0;
        local_4c8[0]._M_allocated_capacity = uVar16;
        if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )uVar15 !=
            (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )0x0) {
          (**(code **)(*(long *)uVar15 + 8))();
        }
        if ((Binder *)local_438._0_8_ != (Binder *)0x0) {
          (**(code **)&(((((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            *)&(((enable_shared_from_this<duckdb::Binder> *)local_438._0_8_)->
                               __weak_this_).internal.
                               super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>)._M_head_impl)->
                       super_BaseExpression).type)();
        }
        local_4c8[0]._8_8_ =
             local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        LogicalType::LogicalType(this_00);
        oVar33.ptr = (LogicalType *)
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     ::operator[](oVar33.ptr,
                                  (size_type)
                                  local_5c8.
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        ExpressionBinder::Bind
                  ((ExpressionBinder *)local_628,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_530,oVar33,SUB81(this_00,0));
        pEVar34 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_628);
        iVar22 = (*(pEVar34->super_BaseExpression)._vptr_BaseExpression[4])(pEVar34);
        bVar21 = ExpressionBinder::PushCollation
                           (local_660->context,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_628,this_00,ALL_COLLATIONS);
        if ((char)iVar22 == '\0' && bVar21) {
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          puVar47 = (pBVar25->aggregates).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar7 = (pBVar25->aggregates).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pmVar35 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_198,(key_type *)&local_5c8);
          *pmVar35 = (long)puVar7 - (long)puVar47 >> 3;
          FirstFunctionGetter::GetFunction((AggregateFunction *)local_438,&pEVar34->return_type);
          local_5f8 = (Binder *)0x0;
          iStack_5f0._M_current = (unsigned_long *)0x0;
          local_5e8 = (ClientContext *)0x0;
          (*(pEVar34->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_648,pEVar34);
          pBVar43 = local_660;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_5f8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_648);
          if ((long *)local_648._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_648._M_dataplus._M_p + 8))();
          }
          FunctionBinder::FunctionBinder((FunctionBinder *)local_5a8,pBVar43);
          SimpleFunction::SimpleFunction((SimpleFunction *)local_160,(SimpleFunction *)local_438);
          local_160._0_8_ = local_448;
          LogicalType::LogicalType((LogicalType *)local_440._M_p,local_5b0.ptr);
          local_160._168_4_ = local_390;
          local_160._0_8_ = local_608.ptr;
          p_Var44 = local_450;
          puVar45 = local_458;
          for (lVar41 = 0xd; lVar41 != 0; lVar41 = lVar41 + -1) {
            *puVar45 = p_Var44->_M_nxt;
            p_Var44 = p_Var44 + (ulong)bVar48 * -2 + 1;
            puVar45 = puVar45 + (ulong)bVar48 * -2 + 1;
          }
          *(undefined2 *)(local_458 + 0xd) = *(undefined2 *)&local_450[0xd]._M_nxt;
          local_40 = local_318;
          local_38 = local_310._M_pi;
          if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_310._M_pi)->_M_use_count = (local_310._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_310._M_pi)->_M_use_count = (local_310._M_pi)->_M_use_count + 1;
            }
          }
          local_308._M_head_impl = (Expression *)local_5f8;
          pBStack_300 = (Binder *)iStack_5f0._M_current;
          local_2f8 = local_5e8;
          local_5f8 = (Binder *)0x0;
          iStack_5f0._M_current = (unsigned_long *)0x0;
          local_5e8 = (ClientContext *)0x0;
          local_5d0 = (pointer)0x0;
          FunctionBinder::BindAggregateFunction
                    ((FunctionBinder *)local_658,(AggregateFunction *)local_5a8,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)local_160,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_308,(AggregateType)&local_5d0);
          if (local_5d0 != (pointer)0x0) {
            (**(code **)((local_5d0->name)._M_dataplus._M_p + 8))();
          }
          local_5d0 = (pointer)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_308);
          local_160._0_8_ = local_608.ptr;
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
          pBVar36 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                                  *)local_658);
          local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_648,"__collated_group","");
          ::std::__cxx11::string::operator=
                    ((string *)&(pBVar36->super_Expression).super_BaseExpression.alias,
                     (string *)&local_648);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p);
          }
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          local_648._M_dataplus._M_p = (pointer)local_658._0_8_;
          local_658._0_8_ = (Binder *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar25->aggregates,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_648);
          if ((long *)local_648._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_648._M_dataplus._M_p + 8))();
          }
          if ((Binder *)local_658._0_8_ != (Binder *)0x0) {
            (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_658._0_8_)->__weak_this_)
                        .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                      .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_5f8);
          local_438._0_8_ = local_608.ptr;
          if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_438);
        }
        pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_670);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar25->groups,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_628);
        pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_568,
                               (size_type)
                               local_5c8.
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        uVar15 = local_4c8[0]._M_allocated_capacity;
        local_4c8[0]._M_allocated_capacity =
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        _Var8._M_head_impl =
             (pvVar26->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pvVar26->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar15;
        if (_Var8._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var8._M_head_impl)->super_BaseExpression + 8))();
        }
        pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_568,
                               (size_type)
                               local_5c8.
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        ExpressionBinder::QualifyColumnNames(local_660,pvVar26);
        pLVar14 = local_5c8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_568,
                               (size_type)
                               local_5c8.
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        local_438._0_8_ =
             unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(pvVar26);
        pmVar31 = ::std::__detail::
                  _Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_208,(key_type *)local_438);
        oVar33.ptr = local_5d8.ptr;
        *pmVar31 = (mapped_type)pLVar14;
        if (local_628 != (undefined1  [8])0x0) {
          (**(code **)((((string *)local_628)->_M_dataplus)._M_p + 8))();
        }
        LogicalType::~LogicalType(this_00);
        local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&(((string *)
                               &(local_5c8.
                                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->id_)->_M_dataplus)._M_p
                      + 1);
      } while (local_5c8.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start <
               (pointer)((long)(local_668->groups).group_expressions.
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_668->groups).group_expressions.
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_530 = (undefined1  [8])&PTR__GroupBinder_019ad400;
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_4a0);
    if ((ParsedExpression *)local_4c8[0]._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_4c8[0]._0_8_ + 8))();
    }
    local_4c8[0]._M_allocated_capacity =
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_530);
    pBVar43 = local_660;
  }
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pSVar42 = local_668;
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::_M_move_assign(&(pBVar25->groups).grouping_sets.
                    super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ,&(local_668->groups).grouping_sets);
  local_5b0.ptr = (LogicalType *)&pSVar42->having;
  if ((pSVar42->having).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pCVar6 = pBVar43->context;
    pBVar32 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                           *)&local_670);
    HavingBinder::HavingBinder
              ((HavingBinder *)local_438,pBVar43,pCVar6,pBVar32,(BoundGroupInformation *)local_208,
               local_668->aggregate_handling);
    oVar33.ptr = local_5b0.ptr;
    ExpressionBinder::QualifyColumnNames
              ((ExpressionBinder *)local_438,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_5b0.ptr);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_530,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_438,oVar33,false);
    pBVar43 = local_660;
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    auVar13 = local_530;
    local_530 = (undefined1  [8])0x0;
    _Var3._M_head_impl =
         (pBVar25->having).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar25->having).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar13;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_530 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_530 + 8))();
    }
    local_438._0_8_ = &PTR__HavingBinder_019ad490;
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3b0);
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_438);
  }
  local_5a8._32_8_ = (value_type *)0x0;
  _Stack_580._M_p = (pointer)0x0;
  local_578 = 0;
  local_5d8.ptr = (LogicalType *)&local_668->qualify;
  if ((local_668->qualify).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    if (local_668->aggregate_handling == FORCE_AGGREGATES) {
      pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
      local_438._0_8_ = local_428;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Combining QUALIFY with GROUP BY ALL is not supported yet","");
      BinderException::BinderException(pBVar40,(string *)local_438);
      __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar6 = pBVar43->context;
    pBVar32 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                           *)&local_670);
    QualifyBinder::QualifyBinder
              ((QualifyBinder *)local_438,pBVar43,pCVar6,pBVar32,(BoundGroupInformation *)local_208)
    ;
    ExpressionBinder::QualifyColumnNames
              (pBVar43,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_5d8.ptr);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_530,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_438,local_5d8,false);
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    auVar13 = local_530;
    local_530 = (undefined1  [8])0x0;
    _Var3._M_head_impl =
         (pBVar25->qualify).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar25->qualify).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar13;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_530 != (undefined1  [8])0x0) {
      (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
    }
    if (local_3e8.
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3e8.
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_3cf == true) {
        pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
        local_530 = (undefined1  [8])((long)local_528 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_530,"Cannot mix aggregates with non-aggregated columns!","");
        BinderException::BinderException(pBVar40,(string *)local_530);
        __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      operator=((vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                 *)(local_5a8 + 0x20),&local_3e8);
    }
    local_438._0_8_ = &PTR__QualifyBinder_019ad5c0;
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3b0);
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_438);
  }
  pCVar6 = pBVar43->context;
  pBVar32 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_670);
  SelectBinder::SelectBinder
            ((SelectBinder *)local_438,pBVar43,pCVar6,pBVar32,(BoundGroupInformation *)local_208);
  local_5f8 = (Binder *)0x0;
  iStack_5f0._M_current = (unsigned_long *)0x0;
  local_5e8 = (ClientContext *)0x0;
  local_5a8._16_8_ = (pointer)0x0;
  local_5a8._0_8_ = (Binder *)0x0;
  local_5a8._8_8_ = (ClientContext *)0x0;
  local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_628 = (undefined1  [8])0x0;
  if ((local_668->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_668->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pvVar26 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_600.ptr,(size_type)local_628);
      pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar26);
      iVar22 = (*(pPVar28->super_BaseExpression)._vptr_BaseExpression[3])(pPVar28);
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      uVar9 = (pBVar25->unnests)._M_h._M_element_count;
      LogicalType::LogicalType((LogicalType *)&local_648);
      oVar33.ptr = (LogicalType *)
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                 *)local_600.ptr,(size_type)local_628);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_658,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_438,oVar33,SUB81(&local_648,0));
      auVar13 = local_628;
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      pBVar43 = (Binder *)pBVar25->column_count;
      local_608.ptr._0_1_ = local_668->aggregate_handling == FORCE_AGGREGATES;
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      pBVar25->bound_column_count = pBVar25->bound_column_count + 1;
      pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_658);
      if ((pEVar37->super_BaseExpression).type == BOUND_EXPANDED) {
        if (pBVar43 <= (ulong)auVar13) {
          pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
          local_530 = (undefined1  [8])((long)local_528 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_530,
                     "UNNEST of struct cannot be used in ORDER BY/DISTINCT ON clause","");
          BinderException::BinderException(pBVar40,(string *)local_530);
          __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_668->aggregate_handling == FORCE_AGGREGATES) {
          pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
          local_530 = (undefined1  [8])((long)local_528 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_530,"UNNEST of struct cannot be combined with GROUP BY ALL","")
          ;
          BinderException::BinderException(pBVar40,(string *)local_530);
          __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_658);
        pBVar38 = BaseExpression::Cast<duckdb::BoundExpandedExpression>
                            (&pEVar37->super_BaseExpression);
        puVar7 = (pBVar38->expanded_expressions).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar47 = (pBVar38->expanded_expressions).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar47 != puVar7;
            puVar47 = puVar47 + 1) {
          pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar47);
          (*(pEVar37->super_BaseExpression)._vptr_BaseExpression[7])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                     pEVar37);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
          ;
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530);
          }
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar47);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&(pBVar25->super_BoundQueryNode).types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     &pEVar37->return_type);
          pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar47);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_5c8,&pEVar37->return_type);
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar25->select_list,puVar47);
        }
        SelectBindState::AddExpandedColumn
                  ((SelectBindState *)local_658._8_8_,
                   (long)(pBVar38->expanded_expressions).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar38->expanded_expressions).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
      }
      else {
        pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_658);
        iVar23 = (*(pEVar37->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar37);
        if ((char)iVar23 != '\0') {
          SelectBindState::SetExpressionIsVolatile
                    ((SelectBindState *)local_658._8_8_,(idx_t)local_628);
        }
        pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_658);
        iVar23 = (*(pEVar37->super_BaseExpression)._vptr_BaseExpression[4])(pEVar37);
        if ((char)iVar23 != '\0') {
          SelectBindState::SetExpressionHasSubquery
                    ((SelectBindState *)local_658._8_8_,(idx_t)local_628);
        }
        SelectBindState::AddRegularColumn((SelectBindState *)local_658._8_8_);
        bVar48 = (byte)local_608.ptr & (ulong)auVar13 < pBVar43;
        local_608.ptr._0_1_ = bVar48;
        if ((bVar48 != 0) &&
           (local_3e8.
            super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_3e8.
            super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          if (local_3cf == true) {
            pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
            local_530 = (undefined1  [8])((long)local_528 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_530,"Cannot mix aggregates with non-aggregated columns!","");
            BinderException::BinderException(pBVar40,(string *)local_530);
            __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((char)iVar22 != '\0') {
            pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
            local_530 = (undefined1  [8])((long)local_528 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_530,"Cannot group on a window clause","");
            BinderException::BinderException(pBVar40,(string *)local_530);
            __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          if (uVar9 < (pBVar25->unnests)._M_h._M_element_count) {
            pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
            local_530 = (undefined1  [8])((long)local_528 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_530,"Cannot group on an UNNEST or UNLIST clause","");
            BinderException::BinderException(pBVar40,(string *)local_530);
            __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((ClientContext *)iStack_5f0._M_current == local_5e8) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_5f8,iStack_5f0,
                       (unsigned_long *)local_628);
          }
          else {
            *iStack_5f0._M_current = (unsigned_long)local_628;
            iStack_5f0._M_current = iStack_5f0._M_current + 1;
          }
        }
        pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_670);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar25->select_list,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_658);
        if ((ulong)auVar13 < pBVar43) {
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          pvVar30 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&(pBVar25->super_BoundQueryNode).names,(size_type)local_628);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5a8,
                     pvVar30);
          pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                    ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                  *)&local_670);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&(pBVar25->super_BoundQueryNode).types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (value_type *)&local_648);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_5c8,(value_type *)&local_648);
        pBVar20 = local_3e8.
                  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = local_3e8.
                  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((byte)local_608.ptr != '\0') &&
           (local_3cf = false,
           pBVar46 = local_3e8.
                     super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           local_3e8.
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_3e8.
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start)) {
          do {
            pcVar11 = (pBVar46->name)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar11 != &(pBVar46->name).field_2) {
              operator_delete(pcVar11);
            }
            pBVar46 = pBVar46 + 1;
          } while (pBVar46 != pBVar20);
          local_3e8.
          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar19;
        }
      }
      if ((Binder *)local_658._0_8_ != (Binder *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_658._0_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      LogicalType::~LogicalType((LogicalType *)&local_648);
      local_628 = (undefined1  [8])
                  ((long)&(((enable_shared_from_this<duckdb::Binder> *)local_628)->__weak_this_).
                          internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1);
    } while ((ulong)local_628 <
             (Binder *)
             ((long)(local_668->select_list).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_668->select_list).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_608.ptr = (DummyBinding *)iStack_5f0._M_current;
  local_600.ptr = (vector<duckdb::DummyBinding,_true> *)local_5f8;
  if (local_5f8 != (Binder *)iStack_5f0._M_current) {
    do {
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&pBVar25->select_list,
                             (size_type)
                             ((Binding *)
                             &(local_600.ptr)->
                              super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                             )->_vptr_Binding);
      pEVar37 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_02);
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      iVar24 = pBVar25->group_index;
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      puVar47 = (pBVar25->groups).group_expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar7 = (pBVar25->groups).group_expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_03._M_head_impl = (Expression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_530,&pEVar37->return_type);
      binding.column_index = (long)puVar47 - (long)puVar7 >> 3;
      binding.table_index = iVar24;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)this_03._M_head_impl,(LogicalType *)local_530,binding,0
                );
      LogicalType::~LogicalType((LogicalType *)local_530);
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar25->groups,this_02);
      _Var3._M_head_impl =
           (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_03._M_head_impl;
      if (_Var3._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
      local_600.ptr =
           (vector<duckdb::DummyBinding,_true> *)
           &((Binding *)
            &(local_600.ptr)->
             super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>)->
            binding_type;
    } while ((DummyBinding *)local_600.ptr != local_608.ptr);
  }
  local_528._16_8_ = local_528;
  local_528._0_4_ = _S_red;
  local_528._8_8_ = (element_type *)0x0;
  local_508[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_510.ptr = (DummyBinding *)local_528._16_8_;
  if (local_5f8 != (Binder *)iStack_5f0._M_current) {
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    local_648._M_dataplus._M_p = (pointer)0x0;
    lVar41 = (long)(pBVar25->groups).group_expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar25->groups).group_expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar41 != 0) {
      do {
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)local_530,(unsigned_long *)&local_648);
        local_648._M_dataplus._M_p = local_648._M_dataplus._M_p + 1;
      } while (local_648._M_dataplus._M_p < (pointer)(lVar41 >> 3));
    }
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_670);
    ::std::
    vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::push_back(&(pBVar25->groups).grouping_sets.
                 super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ,(value_type *)local_530);
  }
  uVar16 = local_5a8._8_8_;
  uVar15 = local_5a8._0_8_;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->column_count = (long)(uVar16 - uVar15) >> 5;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  local_648._M_dataplus._M_p =
       (pointer)(pBVar25->super_BoundQueryNode).names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_648._M_string_length =
       (size_type)
       (pBVar25->super_BoundQueryNode).names.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_648.field_2._M_allocated_capacity =
       (size_type)
       (pBVar25->super_BoundQueryNode).names.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar25->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
  (pBVar25->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
  (pBVar25->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
  local_5a8._0_8_ = (Binder *)0x0;
  local_5a8._8_8_ = (ClientContext *)0x0;
  local_5a8._16_8_ = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_648);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  puVar47 = (pBVar25->select_list).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = (pBVar25->select_list).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  uVar9 = pBVar25->column_count;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  pBVar25->need_prune = uVar9 < (ulong)((long)puVar47 - (long)puVar7 >> 3);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  if (((((pBVar25->groups).group_expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pBVar25->groups).group_expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_670),
       (pBVar25->aggregates).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pBVar25->aggregates).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
      ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       *(__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *
        )local_5b0.ptr !=
       (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       )0x0)) ||
     (pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670),
     (pBVar25->groups).grouping_sets.
     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     .
     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     (pBVar25->groups).grouping_sets.
     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     .
     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    if (local_668->aggregate_handling == NO_AGGREGATES_ALLOWED) {
      pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_648,"Aggregates cannot be present in a Project relation!","");
      BinderException::BinderException(pBVar40,&local_648);
      __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_628 = (undefined1  [8])0x0;
    pBStack_620 = (Binder *)0x0;
    local_618 = (ClientContext *)0x0;
    if (local_3e8.
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3e8.
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      operator=((vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                 *)local_628,&local_3e8);
    }
    _Var17._M_p = _Stack_580._M_p;
    if ((pointer)local_5a8._32_8_ != _Stack_580._M_p) {
      __x = (value_type *)local_5a8._32_8_;
      do {
        ::std::
        vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ::push_back((vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                     *)local_628,__x);
        __x = __x + 1;
      } while (__x != (value_type *)_Var17._M_p);
    }
    if (local_628 != (undefined1  [8])pBStack_620) {
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      local_648._M_string_length = 0;
      local_648.field_2._M_allocated_capacity =
           local_648.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ::std::__cxx11::string::operator=
                ((string *)&local_648,
                 "column \"%s\" must appear in the GROUP BY clause or must be part of an aggregate function."
                );
      if (local_668->aggregate_handling != FORCE_AGGREGATES) {
        ::std::__cxx11::string::append((char *)&local_648);
        pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
        pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                            ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
        oVar10.index = (pvVar39->query_location).index;
        pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                            ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        pcVar11 = (pvVar39->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pcVar11,pcVar11 + (pvVar39->name)._M_string_length);
        pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                            ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
        local_268._0_8_ = local_268 + 0x10;
        pcVar11 = (pvVar39->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,pcVar11,pcVar11 + (pvVar39->name)._M_string_length);
        pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                            ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        pcVar11 = (pvVar39->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,pcVar11,pcVar11 + (pvVar39->name)._M_string_length);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar40,oVar10,&local_648,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   &local_2d0);
        __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::append((char *)&local_648);
      pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
      pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                          ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
      oVar10.index = (pvVar39->query_location).index;
      pvVar39 = vector<duckdb::BoundColumnReferenceInfo,_true>::operator[]
                          ((vector<duckdb::BoundColumnReferenceInfo,_true> *)local_628,0);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      pcVar11 = (pvVar39->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar11,pcVar11 + (pvVar39->name)._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar40,oVar10,&local_648,&local_228);
      __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
    ~vector((vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
             *)local_628);
  }
  if (((((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          *)&(((string *)&(local_5d8.ptr)->id_)->_M_dataplus)._M_p)->_M_t).
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
       (ParsedExpression *)0x0) &&
     (pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_670),
     (pBVar25->windows).
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start ==
     (pBVar25->windows).
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    pBVar40 = (BinderException *)__cxa_allocate_exception(0x10);
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_648,
               "at least one window function must appear in the SELECT column or QUALIFY clause","")
    ;
    BinderException::BinderException(pBVar40,&local_648);
    __cxa_throw(pBVar40,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar32 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_670);
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  iVar24 = pBVar25->projection_index;
  pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_670);
  BindModifiers(local_660,&pBVar32->super_BoundQueryNode,iVar24,
                &(pBVar25->super_BoundQueryNode).names,
                (vector<duckdb::LogicalType,_true> *)&local_5c8,(SelectBindState *)local_658._8_8_);
  _Var18._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       local_460._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  _Var12._M_head_impl = local_670._M_head_impl;
  local_670._M_head_impl = (BoundSelectNode *)0x0;
  *(BoundSelectNode **)
   local_460._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
   super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = _Var12._M_head_impl;
  ::std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_530);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5c8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5a8);
  if (local_5f8 != (Binder *)0x0) {
    operator_delete(local_5f8);
  }
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_438);
  ::std::vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ::~vector((vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
             *)(local_5a8 + 0x20));
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_198);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_1d0);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_208);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_568);
  if ((vector<duckdb::DummyBinding,_true> *)local_2b0._40_8_ !=
      (vector<duckdb::DummyBinding,_true> *)(local_2b0 + 0x38)) {
    operator_delete((void *)local_2b0._40_8_);
  }
  if ((Expression *)local_2b0._0_8_ != (Expression *)0x0) {
    operator_delete((void *)local_2b0._0_8_);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_548);
  if (local_670._M_head_impl != (BoundSelectNode *)0x0) {
    (*((local_670._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode[1])();
  }
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
         _Var18._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindSelectNode(SelectNode &statement, unique_ptr<BoundTableRef> from_table) {
	D_ASSERT(from_table);
	D_ASSERT(!statement.from_table);
	auto result = make_uniq<BoundSelectNode>();
	result->projection_index = GenerateTableIndex();
	result->group_index = GenerateTableIndex();
	result->aggregate_index = GenerateTableIndex();
	result->groupings_index = GenerateTableIndex();
	result->window_index = GenerateTableIndex();
	result->prune_index = GenerateTableIndex();

	result->from_table = std::move(from_table);
	// bind the sample clause
	if (statement.sample) {
		result->sample_options = std::move(statement.sample);
	}

	// visit the select list and expand any "*" statements
	vector<unique_ptr<ParsedExpression>> new_select_list;
	ExpandStarExpressions(statement.select_list, new_select_list);

	if (new_select_list.empty()) {
		throw BinderException("SELECT list is empty after resolving * expressions!");
	}
	statement.select_list = std::move(new_select_list);

	auto &bind_state = result->bind_state;
	for (idx_t i = 0; i < statement.select_list.size(); i++) {
		auto &expr = statement.select_list[i];
		result->names.push_back(expr->GetName());
		ExpressionBinder::QualifyColumnNames(*this, expr);
		if (!expr->GetAlias().empty()) {
			bind_state.alias_map[expr->GetAlias()] = i;
			result->names[i] = expr->GetAlias();
		}
		bind_state.projection_map[*expr] = i;
		bind_state.original_expressions.push_back(expr->Copy());
	}
	result->column_count = statement.select_list.size();

	// first visit the WHERE clause
	// the WHERE clause happens before the GROUP BY, PROJECTION or HAVING clauses
	if (statement.where_clause) {
		// bind any star expressions in the WHERE clause
		BindWhereStarExpression(statement.where_clause);

		ColumnAliasBinder alias_binder(bind_state);
		WhereBinder where_binder(*this, context, &alias_binder);
		unique_ptr<ParsedExpression> condition = std::move(statement.where_clause);
		result->where_clause = where_binder.Bind(condition);
	}

	// now bind all the result modifiers; including DISTINCT and ORDER BY targets
	OrderBinder order_binder({*this}, statement, bind_state);
	PrepareModifiers(order_binder, statement, *result);

	vector<unique_ptr<ParsedExpression>> unbound_groups;
	BoundGroupInformation info;
	auto &group_expressions = statement.groups.group_expressions;
	if (!group_expressions.empty()) {
		// the statement has a GROUP BY clause, bind it
		unbound_groups.resize(group_expressions.size());
		GroupBinder group_binder(*this, context, statement, result->group_index, bind_state, info.alias_map);
		for (idx_t i = 0; i < group_expressions.size(); i++) {

			// we keep a copy of the unbound expression;
			// we keep the unbound copy around to check for group references in the SELECT and HAVING clause
			// the reason we want the unbound copy is because we want to figure out whether an expression
			// is a group reference BEFORE binding in the SELECT/HAVING binder
			group_binder.unbound_expression = group_expressions[i]->Copy();
			group_binder.bind_index = i;

			// bind the groups
			LogicalType group_type;
			auto bound_expr = group_binder.Bind(group_expressions[i], &group_type);
			D_ASSERT(bound_expr->return_type.id() != LogicalTypeId::INVALID);

			// find out whether the expression contains a subquery, it can't be copied if so
			auto &bound_expr_ref = *bound_expr;
			bool contains_subquery = bound_expr_ref.HasSubquery();

			// push a potential collation, if necessary
			bool requires_collation = ExpressionBinder::PushCollation(context, bound_expr, group_type);
			if (!contains_subquery && requires_collation) {
				// if there is a collation on a group x, we should group by the collated expr,
				// but also push a first(x) aggregate in case x is selected (uncollated)
				info.collated_groups[i] = result->aggregates.size();

				auto first_fun = FirstFunctionGetter::GetFunction(bound_expr_ref.return_type);
				vector<unique_ptr<Expression>> first_children;
				// FIXME: would be better to just refer to this expression, but for now we copy
				first_children.push_back(bound_expr_ref.Copy());

				FunctionBinder function_binder(*this);
				auto function = function_binder.BindAggregateFunction(first_fun, std::move(first_children));
				function->SetAlias("__collated_group");
				result->aggregates.push_back(std::move(function));
			}
			result->groups.group_expressions.push_back(std::move(bound_expr));

			// in the unbound expression we DO bind the table names of any ColumnRefs
			// we do this to make sure that "table.a" and "a" are treated the same
			// if we wouldn't do this then (SELECT test.a FROM test GROUP BY a) would not work because "test.a" <> "a"
			// hence we convert "a" -> "test.a" in the unbound expression
			unbound_groups[i] = std::move(group_binder.unbound_expression);
			ExpressionBinder::QualifyColumnNames(*this, unbound_groups[i]);
			info.map[*unbound_groups[i]] = i;
		}
	}
	result->groups.grouping_sets = std::move(statement.groups.grouping_sets);

	// bind the HAVING clause, if any
	if (statement.having) {
		HavingBinder having_binder(*this, context, *result, info, statement.aggregate_handling);
		ExpressionBinder::QualifyColumnNames(having_binder, statement.having);
		result->having = having_binder.Bind(statement.having);
	}

	// bind the QUALIFY clause, if any
	vector<BoundColumnReferenceInfo> bound_qualify_columns;
	if (statement.qualify) {
		if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
			throw BinderException("Combining QUALIFY with GROUP BY ALL is not supported yet");
		}
		QualifyBinder qualify_binder(*this, context, *result, info);
		ExpressionBinder::QualifyColumnNames(*this, statement.qualify);
		result->qualify = qualify_binder.Bind(statement.qualify);
		if (qualify_binder.HasBoundColumns()) {
			if (qualify_binder.BoundAggregates()) {
				throw BinderException("Cannot mix aggregates with non-aggregated columns!");
			}
			bound_qualify_columns = qualify_binder.GetBoundColumns();
		}
	}

	// after that, we bind to the SELECT list
	SelectBinder select_binder(*this, context, *result, info);

	// if we expand select-list expressions, e.g., via UNNEST, then we need to possibly
	// adjust the column index of the already bound ORDER BY modifiers, and not only set their types
	vector<idx_t> group_by_all_indexes;
	vector<string> new_names;
	vector<LogicalType> internal_sql_types;

	for (idx_t i = 0; i < statement.select_list.size(); i++) {
		bool is_window = statement.select_list[i]->IsWindow();
		idx_t unnest_count = result->unnests.size();
		LogicalType result_type;
		auto expr = select_binder.Bind(statement.select_list[i], &result_type, true);
		bool is_original_column = i < result->column_count;
		bool can_group_by_all =
		    statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES && is_original_column;
		result->bound_column_count++;

		if (expr->GetExpressionType() == ExpressionType::BOUND_EXPANDED) {
			if (!is_original_column) {
				throw BinderException("UNNEST of struct cannot be used in ORDER BY/DISTINCT ON clause");
			}
			if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
				throw BinderException("UNNEST of struct cannot be combined with GROUP BY ALL");
			}

			auto &expanded = expr->Cast<BoundExpandedExpression>();
			auto &struct_expressions = expanded.expanded_expressions;
			D_ASSERT(!struct_expressions.empty());

			for (auto &struct_expr : struct_expressions) {
				new_names.push_back(struct_expr->GetName());
				result->types.push_back(struct_expr->return_type);
				internal_sql_types.push_back(struct_expr->return_type);
				result->select_list.push_back(std::move(struct_expr));
			}
			bind_state.AddExpandedColumn(struct_expressions.size());
			continue;
		}

		if (expr->IsVolatile()) {
			bind_state.SetExpressionIsVolatile(i);
		}
		if (expr->HasSubquery()) {
			bind_state.SetExpressionHasSubquery(i);
		}
		bind_state.AddRegularColumn();

		if (can_group_by_all && select_binder.HasBoundColumns()) {
			if (select_binder.BoundAggregates()) {
				throw BinderException("Cannot mix aggregates with non-aggregated columns!");
			}
			if (is_window) {
				throw BinderException("Cannot group on a window clause");
			}
			if (result->unnests.size() > unnest_count) {
				throw BinderException("Cannot group on an UNNEST or UNLIST clause");
			}
			// we are forcing aggregates, and the node has columns bound
			// this entry becomes a group
			group_by_all_indexes.push_back(i);
		}

		result->select_list.push_back(std::move(expr));
		if (is_original_column) {
			new_names.push_back(std::move(result->names[i]));
			result->types.push_back(result_type);
		}
		internal_sql_types.push_back(result_type);

		if (can_group_by_all) {
			select_binder.ResetBindings();
		}
	}

	// push the GROUP BY ALL expressions into the group set

	for (auto &group_by_all_index : group_by_all_indexes) {
		auto &expr = result->select_list[group_by_all_index];
		auto group_ref = make_uniq<BoundColumnRefExpression>(
		    expr->return_type, ColumnBinding(result->group_index, result->groups.group_expressions.size()));
		result->groups.group_expressions.push_back(std::move(expr));
		expr = std::move(group_ref);
	}
	set<idx_t> group_by_all_indexes_set;
	if (!group_by_all_indexes.empty()) {
		idx_t num_set_indexes = result->groups.group_expressions.size();
		for (idx_t i = 0; i < num_set_indexes; i++) {
			group_by_all_indexes_set.insert(i);
		}
		D_ASSERT(result->groups.grouping_sets.empty());
		result->groups.grouping_sets.push_back(group_by_all_indexes_set);
	}
	result->column_count = new_names.size();
	result->names = std::move(new_names);
	result->need_prune = result->select_list.size() > result->column_count;

	// in the normal select binder, we bind columns as if there is no aggregation
	// i.e. in the query [SELECT i, SUM(i) FROM integers;] the "i" will be bound as a normal column
	// since we have an aggregation, we need to either (1) throw an error, or (2) wrap the column in a FIRST() aggregate
	// we choose the former one [CONTROVERSIAL: this is the PostgreSQL behavior]
	if (!result->groups.group_expressions.empty() || !result->aggregates.empty() || statement.having ||
	    !result->groups.grouping_sets.empty()) {
		if (statement.aggregate_handling == AggregateHandling::NO_AGGREGATES_ALLOWED) {
			throw BinderException("Aggregates cannot be present in a Project relation!");
		} else {
			vector<BoundColumnReferenceInfo> bound_columns;
			if (select_binder.HasBoundColumns()) {
				bound_columns = select_binder.GetBoundColumns();
			}
			for (auto &bound_qualify_col : bound_qualify_columns) {
				bound_columns.push_back(bound_qualify_col);
			}
			if (!bound_columns.empty()) {
				string error;
				error = "column \"%s\" must appear in the GROUP BY clause or must be part of an aggregate function.";
				if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
					error += "\nGROUP BY ALL will only group entries in the SELECT list. Add it to the SELECT list or "
					         "GROUP BY this entry explicitly.";
					throw BinderException(bound_columns[0].query_location, error, bound_columns[0].name);
				} else {
					error +=
					    "\nEither add it to the GROUP BY list, or use \"ANY_VALUE(%s)\" if the exact value of \"%s\" "
					    "is not important.";
					throw BinderException(bound_columns[0].query_location, error, bound_columns[0].name,
					                      bound_columns[0].name, bound_columns[0].name);
				}
			}
		}
	}

	// QUALIFY clause requires at least one window function to be specified in at least one of the SELECT column list or
	// the filter predicate of the QUALIFY clause
	if (statement.qualify && result->windows.empty()) {
		throw BinderException("at least one window function must appear in the SELECT column or QUALIFY clause");
	}

	// now that the SELECT list is bound, we set the types of DISTINCT/ORDER BY expressions
	BindModifiers(*result, result->projection_index, result->names, internal_sql_types, bind_state);
	return std::move(result);
}